

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O2

void __thiscall
duckdb::AlpRDCompressionState<double>::CompressVector(AlpRDCompressionState<double> *this)

{
  atomic<unsigned_long> *paVar1;
  double new_value;
  __int_type _Var2;
  bool bVar3;
  pointer pCVar4;
  idx_t i;
  ulong uVar5;
  idx_t iVar6;
  
  if (this->nulls_idx != 0) {
    alp::AlpUtils::FindAndReplaceNullsInVector<unsigned_long>
              (this->input_vector,this->vector_null_positions,this->vector_idx,this->nulls_idx);
  }
  alp::AlpRDCompression<double,_false>::Compress(this->input_vector,this->vector_idx,&this->state);
  bVar3 = HasEnoughSpace(this);
  if (!bVar3) {
    pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    iVar6 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var2 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var2 + iVar6);
  }
  iVar6 = this->vector_idx;
  if (iVar6 != this->nulls_idx) {
    for (uVar5 = 0; uVar5 < iVar6; uVar5 = uVar5 + 1) {
      new_value = (double)this->input_vector[uVar5];
      pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      NumericStats::Update<double>(&(pCVar4->stats).statistics.stats_union.numeric_data,new_value);
      iVar6 = this->vector_idx;
    }
  }
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + iVar6;
  UNLOCK();
  FlushVector(this);
  return;
}

Assistant:

void CompressVector() {
		if (nulls_idx) {
			alp::AlpUtils::FindAndReplaceNullsInVector<EXACT_TYPE>(input_vector, vector_null_positions, vector_idx,
			                                                       nulls_idx);
		}
		alp::AlpRDCompression<T, false>::Compress(input_vector, vector_idx, state);
		//! Check if the compressed vector fits on current segment
		if (!HasEnoughSpace()) {
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}
		if (vector_idx != nulls_idx) { //! At least there is one valid value in the vector
			for (idx_t i = 0; i < vector_idx; i++) {
				T floating_point_value = Load<T>(const_data_ptr_cast(&input_vector[i]));
				current_segment->stats.statistics.UpdateNumericStats<T>(floating_point_value);
			}
		}
		current_segment->count += vector_idx;
		FlushVector();
	}